

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O1

int __thiscall pstore::file::file_handle::open(file_handle *this,char *__file,int __oflag,...)

{
  pointer pcVar1;
  int *piVar2;
  int in_ECX;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar4 = (int)__file;
  close(this,iVar4);
  this->is_writable_ = __oflag == 1;
  uVar5 = (uint)(__oflag == 1) * 2;
  if (iVar4 == 2) {
    uVar5 = uVar5 | 0x40;
  }
  else if (iVar4 == 0) {
    uVar5 = uVar5 | 0xc0;
  }
  uVar3 = 0x124;
  if (__oflag == 1) {
    uVar3 = 0x1b6;
  }
  uVar5 = ::open((this->path_)._M_dataplus._M_p,uVar5,uVar3);
  piVar2 = (int *)(ulong)uVar5;
  this->file_ = uVar5;
  if (uVar5 == 0xffffffff) {
    piVar2 = __errno_location();
    iVar4 = *piVar2;
    if ((in_ECX != 0) || (iVar4 != 2)) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      pcVar1 = (this->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar1,pcVar1 + (this->path_)._M_string_length);
      (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
                (iVar4,"Unable to open",&local_40);
    }
    this->file_ = -1;
  }
  return (int)piVar2;
}

Assistant:

void file_handle::open (create_mode const create, writable_mode const writable,
                                present_mode const present) {
            this->close ();

            is_writable_ = writable == writable_mode::read_write;

            int oflag = is_writable_ ? O_RDWR : O_RDONLY;
            switch (create) {
            // Creates a new file, only if it does not already exist
            case create_mode::create_new:
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                oflag |= O_CREAT | O_EXCL;
                break;
            // Opens a file only if it already exists
            case create_mode::open_existing: break;
            // Opens an existing file if present, and creates a new file otherwise.
            case create_mode::open_always:
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                oflag |= O_CREAT;
                break;
            }

            // user, group, and others have read permission.
            // NOLINTNEXTLINE(hicpp-signed-bitwise)
            mode_t pmode = S_IRUSR | S_IRGRP | S_IROTH;
            if (is_writable_) {
                // user, group, and others have read and write permission.
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                pmode |= S_IWUSR | S_IWGRP | S_IWOTH;
            }

            file_ = ::open (path_.c_str (), oflag, pmode); // NOLINT
            if (file_ == -1) {
                int const err = errno;
                if (present == present_mode::allow_not_found && err == ENOENT) {
                    file_ = -1;
                } else {
                    raise_file_error (err, "Unable to open", path_);
                }
            }
        }